

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-messages.c
# Opt level: O0

void borg_load_read_message(char *message,borg_read_message *read_message)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  int part_len;
  char *var;
  char *suffix;
  borg_read_message *read_message_local;
  char *message_local;
  
  read_message->message_p1 = (char *)0x0;
  read_message->message_p2 = (char *)0x0;
  read_message->message_p3 = (char *)0x0;
  pcVar3 = strchr(message,0x7d);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = borg_trim_lead_space(message);
    pcVar3 = string_make(pcVar3);
    read_message->message_p1 = pcVar3;
  }
  else {
    var = message;
    if (*message == '{') {
      var = pcVar3 + 1;
    }
    pcVar3 = strchr(var,0x7b);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = borg_trim_lead_space(var);
      pcVar3 = string_make(pcVar3);
      read_message->message_p1 = pcVar3;
    }
    else {
      for (; *var == ' '; var = var + 1) {
      }
      sVar4 = strlen(var);
      sVar5 = strlen(pcVar3);
      pcVar6 = format("%.*s",(ulong)(uint)((int)sVar4 - (int)sVar5),var);
      pcVar6 = string_make(pcVar6);
      read_message->message_p1 = pcVar6;
      pcVar3 = strchr(pcVar3,0x7d);
      if (pcVar3 != (char *)0x0) {
        var = pcVar3 + 1;
        pcVar3 = strchr(var,0x7b);
        if (pcVar3 == (char *)0x0) {
          for (; *var == ' '; var = var + 1) {
          }
          sVar4 = strlen(var);
          if ((sVar4 != 0) && (iVar1 = strcmp(var,"."), iVar1 != 0)) {
            pcVar3 = string_make(var);
            read_message->message_p2 = pcVar3;
          }
        }
        else {
          for (; *var == ' '; var = var + 1) {
          }
          sVar4 = strlen(var);
          sVar5 = strlen(pcVar3);
          uVar2 = (int)sVar4 - (int)sVar5;
          if (uVar2 != 0) {
            pcVar6 = format("%.*s",(ulong)uVar2,var);
            pcVar6 = borg_trim_lead_space(pcVar6);
            pcVar6 = string_make(pcVar6);
            read_message->message_p2 = pcVar6;
          }
          pcVar3 = strchr(pcVar3,0x7d);
          if (pcVar3 != (char *)0x0) {
            var = pcVar3 + 1;
            pcVar3 = strchr(var,0x7b);
            if (pcVar3 == (char *)0x0) {
              for (; *var == ' '; var = var + 1) {
              }
              sVar4 = strlen(var);
              if ((sVar4 != 0) && (iVar1 = strcmp(var,"."), iVar1 != 0)) {
                if (read_message->message_p2 == (char *)0x0) {
                  pcVar3 = borg_trim_lead_space(var);
                  pcVar3 = string_make(pcVar3);
                  read_message->message_p2 = pcVar3;
                }
                else {
                  pcVar3 = borg_trim_lead_space(var);
                  pcVar3 = string_make(pcVar3);
                  read_message->message_p3 = pcVar3;
                }
              }
            }
            else {
              for (; *var == ' '; var = var + 1) {
              }
              sVar4 = strlen(var);
              sVar5 = strlen(pcVar3);
              uVar2 = (int)sVar4 - (int)sVar5;
              if (read_message->message_p2 == (char *)0x0) {
                pcVar3 = format("%.*s",(ulong)uVar2,var);
                pcVar3 = borg_trim_lead_space(pcVar3);
                pcVar3 = string_make(pcVar3);
                read_message->message_p2 = pcVar3;
              }
              else {
                pcVar3 = format("%.*s",(ulong)uVar2,var);
                pcVar3 = borg_trim_lead_space(pcVar3);
                pcVar3 = string_make(pcVar3);
                read_message->message_p3 = pcVar3;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void borg_load_read_message(
    char *message, struct borg_read_message *read_message)
{
    read_message->message_p1 = NULL;
    read_message->message_p2 = NULL;
    read_message->message_p3 = NULL;

    char *suffix             = strchr(message, '}');
    if (!suffix) {
        /* no variables, use message as is */
        read_message->message_p1 = string_make(borg_trim_lead_space(message));
        return;
    }
    /* skip leading variable, if there is one */
    if (message[0] == '{')
        suffix++;
    else
        suffix = message;
    char *var = strchr(suffix, '{');
    if (!var) {
        /* one variable, use message post variable */
        read_message->message_p1 = string_make(borg_trim_lead_space(suffix));
        return;
    }
    while (suffix[0] == ' ')
        suffix++;
    int part_len             = strlen(suffix) - strlen(var);
    read_message->message_p1 = string_make(format("%.*s", part_len, suffix));
    suffix += part_len;
    suffix = strchr(var, '}');
    if (!suffix)
        return; /* this should never happen but ... if a string is { with no }*/
    suffix++;
    var = strchr(suffix, '{');
    if (!var) {
        while (suffix[0] == ' ')
            suffix++;

        /* two variables, ignore if last part is just . */
        if (strlen(suffix) && !streq(suffix, "."))
            read_message->message_p2 = string_make(suffix);
        return;
    }
    while (suffix[0] == ' ')
        suffix++;
    part_len = strlen(suffix) - strlen(var);
    if (part_len) {
        read_message->message_p2 = string_make(
            borg_trim_lead_space(format("%.*s", part_len, suffix)));
    }
    suffix += part_len;
    suffix = strchr(var, '}');
    if (!suffix)
        return; /* this should never happen but ... if a string is { with no }*/
    suffix++;
    var = strchr(suffix, '{');
    if (!var) {
        while (suffix[0] == ' ')
            suffix++;
        /* three variables, ignore if last part is just . */
        if (strlen(suffix) && !streq(suffix, ".")) {
            if (read_message->message_p2) {
                read_message->message_p3
                    = string_make(borg_trim_lead_space(suffix));
            } else {
                read_message->message_p2
                    = string_make(borg_trim_lead_space(suffix));
            }
        }
        return;
    }
    while (suffix[0] == ' ')
        suffix++;
    part_len = strlen(suffix) - strlen(var);
    if (read_message->message_p2)
        read_message->message_p3 = string_make(
            borg_trim_lead_space(format("%.*s", part_len, suffix)));
    else
        read_message->message_p2 = string_make(
            borg_trim_lead_space(format("%.*s", part_len, suffix)));

    return;
}